

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Node<unsigned_long_long,QSslServerPrivate::SocketData>::
emplaceValue<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
          (Node<unsigned_long_long,QSslServerPrivate::SocketData> *this,Connection *args,
          Connection *args_1,shared_ptr<QTimer> *args_2)

{
  long in_FS_OFFSET;
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  SocketData local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaObject::Connection::Connection((Connection *)local_58,args);
  QMetaObject::Connection::Connection((Connection *)local_60,args_1);
  QSslServerPrivate::SocketData::SocketData
            (&local_50,(Connection)local_58,(Connection)local_60,args_2);
  QSslServerPrivate::SocketData::operator=((SocketData *)(this + 8),&local_50);
  QSslServerPrivate::SocketData::~SocketData(&local_50);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }